

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEAInterface.cpp
# Opt level: O2

int connectnmeainterface(RS232PORT *pNMEAInterfacePseudoRS232Port)

{
  int iVar1;
  
  iVar1 = OpenRS232Port(pNMEAInterfacePseudoRS232Port,szNMEAInterfacePath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(pNMEAInterfacePseudoRS232Port,NMEAInterfaceBaudRate,'\0',0,'\b','\0'
                                ,NMEAInterfaceTimeout);
    if (iVar1 == 0) {
      puts("NMEAInterface connected.");
      return 0;
    }
    puts("Unable to connect to a NMEAInterface.");
    CloseRS232Port(pNMEAInterfacePseudoRS232Port);
  }
  else {
    puts("Unable to connect to a NMEAInterface.");
  }
  return 1;
}

Assistant:

int connectnmeainterface(RS232PORT* pNMEAInterfacePseudoRS232Port)
{
	if (OpenRS232Port(pNMEAInterfacePseudoRS232Port, szNMEAInterfacePath) != EXIT_SUCCESS) 
	{
		printf("Unable to connect to a NMEAInterface.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(pNMEAInterfacePseudoRS232Port, NMEAInterfaceBaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)NMEAInterfaceTimeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a NMEAInterface.\n");
		CloseRS232Port(pNMEAInterfacePseudoRS232Port);
		return EXIT_FAILURE;
	}

	printf("NMEAInterface connected.\n");

	return EXIT_SUCCESS;
}